

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::createInterface
          (FederateState *this,InterfaceType htype,InterfaceHandle handle,string_view key,
          string_view type,string_view units,uint16_t flags)

{
  string_view units_00;
  string_view units_01;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view key_00;
  string_view key_01;
  string_view endpointName;
  char *in_RCX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  size_t in_RDI;
  undefined8 in_R8;
  InterfaceHandle handle_00;
  ushort in_R9W;
  uint uVar1;
  uint16_t unaff_retaddr;
  undefined1 in_stack_00000002 [14];
  uint16_t in_stack_00000010;
  undefined8 in_stack_00000020;
  lock_guard<helics::FederateState> plock;
  mutex_type *in_stack_fffffffffffffed8;
  lock_guard<helics::FederateState> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffeec;
  InterfaceHandle in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd0 [12];
  undefined1 in_stack_ffffffffffffffde;
  size_t sVar2;
  
  handle_00.hid = (BaseType)((ulong)in_R8 >> 0x20);
  sVar2 = in_RDI;
  std::lock_guard<helics::FederateState>::lock_guard
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  switch(in_SIL) {
  case 0x65:
  case 0x73:
    endpointName._M_str = in_RCX;
    endpointName._M_len = sVar2;
    type_02._M_str._4_2_ = in_R9W;
    type_02._0_12_ = in_stack_ffffffffffffffd0;
    type_02._M_str._6_1_ = in_stack_ffffffffffffffde;
    type_02._M_str._7_1_ = in_SIL;
    InterfaceInfo::createEndpoint
              ((InterfaceInfo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               handle_00,endpointName,type_02,unaff_retaddr);
    break;
  default:
    break;
  case 0x69:
    uVar1 = (uint)in_R9W;
    key_01._M_str = in_RCX;
    key_01._M_len = sVar2;
    type_01._M_str._4_2_ = in_R9W;
    type_01._0_12_ = in_stack_ffffffffffffffd0;
    type_01._M_str._6_1_ = in_stack_ffffffffffffffde;
    type_01._M_str._7_1_ = in_SIL;
    units_01._2_14_ = in_stack_00000002;
    units_01._M_len._0_2_ = unaff_retaddr;
    InterfaceInfo::createInput
              ((InterfaceInfo *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               handle_00,key_01,type_01,units_01,in_stack_00000010);
    if ((*(byte *)(in_RDI + 0x37) & 1) != 0) {
      InterfaceInfo::setInputProperty
                ((InterfaceInfo *)CONCAT44(in_stack_fffffffffffffeec,uVar1),
                 in_stack_fffffffffffffef0,(int32_t)((ulong)in_stack_00000020 >> 0x20),
                 (int32_t)in_stack_00000020);
    }
    if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
      InterfaceInfo::setInputProperty
                ((InterfaceInfo *)CONCAT44(in_stack_fffffffffffffeec,uVar1),
                 in_stack_fffffffffffffef0,(int32_t)((ulong)in_stack_00000020 >> 0x20),
                 (int32_t)in_stack_00000020);
    }
    break;
  case 0x70:
    key_00._M_str = in_RCX;
    key_00._M_len = sVar2;
    type_00._M_str._4_2_ = in_R9W;
    type_00._0_12_ = in_stack_ffffffffffffffd0;
    type_00._M_str._6_1_ = in_stack_ffffffffffffffde;
    type_00._M_str._7_1_ = in_SIL;
    units_00._2_14_ = in_stack_00000002;
    units_00._M_len._0_2_ = unaff_retaddr;
    InterfaceInfo::createPublication
              ((InterfaceInfo *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),handle_00,key_00,type_00,
               units_00,in_stack_00000010);
  }
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x5796b7)
  ;
  return;
}

Assistant:

void FederateState::createInterface(InterfaceType htype,
                                    InterfaceHandle handle,
                                    std::string_view key,
                                    std::string_view type,
                                    std::string_view units,
                                    uint16_t flags)
{
    const std::lock_guard<FederateState> plock(*this);
    // this function could be called externally in a multi-threaded context
    switch (htype) {
        case InterfaceType::PUBLICATION:
            interfaceInformation.createPublication(handle, key, type, units, flags);

            break;
        case InterfaceType::INPUT:
            interfaceInformation.createInput(handle, key, type, units, flags);
            if (strict_input_type_checking) {
                interfaceInformation.setInputProperty(handle,
                                                      defs::Options::STRICT_TYPE_CHECKING,
                                                      1);
            }
            if (ignore_unit_mismatch) {
                interfaceInformation.setInputProperty(handle,
                                                      defs::Options::IGNORE_UNIT_MISMATCH,
                                                      1);
            }
            break;
        case InterfaceType::ENDPOINT:
        case InterfaceType::SINK:
            interfaceInformation.createEndpoint(handle, key, type, flags);
            break;
        default:
            break;
    }
}